

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O0

void test<std::vector<unsigned_long,std::allocator<unsigned_long>>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *arities,size_t attempts)

{
  pointer plVar1;
  bool bVar2;
  reference puVar3;
  allocator<char> local_181;
  string local_180;
  default_constructor<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>
  local_160;
  allocator<char> local_139;
  string local_138;
  default_constructor<boost::container::flat_set<long,_std::less<long>,_void>_> local_118;
  allocator<char> local_f1;
  string local_f0;
  default_constructor<std::set<long,_std::less<long>,_std::allocator<long>_>_> local_d0;
  k_ary_constructor<long> local_b0;
  size_t local_a8;
  unsigned_long arity;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_80;
  const_iterator local_78;
  long *local_70;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_68;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_60;
  const_iterator local_58;
  long *local_50;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_48;
  undefined1 local_30 [8];
  vector<long,_std::allocator<long>_> numbers;
  size_t attempts_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *arities_local;
  
  numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)attempts;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_30);
  utility::read<std::vector<long,std::allocator<long>>>
            ((istream *)&std::cin,(vector<long,_std::allocator<long>_> *)local_30);
  local_48._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)local_30);
  local_50 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)local_30);
  std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (local_48,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)local_50
            );
  local_68._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)local_30);
  local_70 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)local_30);
  local_60 = std::unique<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
                       (local_68,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                  )local_70);
  __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
  __normal_iterator<long*>
            ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_58,
             &local_60);
  local_80._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::end
                         ((vector<long,_std::allocator<long>_> *)local_30);
  __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
  __normal_iterator<long*>
            ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_78,
             &local_80);
  std::vector<long,_std::allocator<long>_>::erase
            ((vector<long,_std::allocator<long>_> *)local_30,local_58,local_78);
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(arities);
  arity = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(arities);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&arity);
    plVar1 = numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (!bVar2) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end0);
    plVar1 = numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    local_a8 = *puVar3;
    k_ary_constructor<long>::k_ary_constructor(&local_b0,local_a8);
    test_one<std::vector<long,std::allocator<long>>,k_ary_constructor<long>>
              ((vector<long,_std::allocator<long>_> *)local_30,(size_t)plVar1,&local_b0);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"set",&local_f1);
  default_constructor<std::set<long,_std::less<long>,_std::allocator<long>_>_>::default_constructor
            (&local_d0,&local_f0);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<std::set<long,std::less<long>,std::allocator<long>>>>
            ((vector<long,_std::allocator<long>_> *)local_30,(size_t)plVar1,&local_d0);
  default_constructor<std::set<long,_std::less<long>,_std::allocator<long>_>_>::~default_constructor
            (&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  plVar1 = numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"flat_set",&local_139);
  default_constructor<boost::container::flat_set<long,_std::less<long>,_void>_>::default_constructor
            (&local_118,&local_138);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<boost::container::flat_set<long,std::less<long>,void>>>
            ((vector<long,_std::allocator<long>_> *)local_30,(size_t)plVar1,&local_118);
  default_constructor<boost::container::flat_set<long,_std::less<long>,_void>_>::
  ~default_constructor(&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  plVar1 = numbers.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"hash_set",&local_181);
  default_constructor<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>
  ::default_constructor(&local_160,&local_180);
  test_one<std::vector<long,std::allocator<long>>,default_constructor<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>
            ((vector<long,_std::allocator<long>_> *)local_30,(size_t)plVar1,&local_160);
  default_constructor<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>
  ::~default_constructor(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_30)
  ;
  return;
}

Assistant:

void test (const Container & arities, std::size_t attempts)
{
    using integer_type = std::int64_t;
    std::vector<integer_type> numbers;
    utility::read(std::cin, numbers);
    std::sort(numbers.begin(), numbers.end());
    numbers.erase(std::unique(numbers.begin(), numbers.end()), numbers.end());

    for (auto arity: arities)
    {
        test_one(numbers, attempts, k_ary_constructor<integer_type>(arity));
    }

    test_one(numbers, attempts, default_constructor<std::set<integer_type>>("set"));
    test_one(numbers, attempts, default_constructor<boost::container::flat_set<integer_type>>("flat_set"));
    test_one(numbers, attempts, default_constructor<std::unordered_set<integer_type>>("hash_set"));
}